

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

Ray * __thiscall
ThinLensCamera::generateRay
          (Ray *__return_storage_ptr__,ThinLensCamera *this,int x,int y,mt19937 *rng)

{
  Vector3f *v;
  Vector3f *v0;
  Vector3f *v2;
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  result_type rVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar8 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector3f df;
  Vector3f local_e4;
  Vector3f g;
  Vector3f local_cc [2];
  Vector3f local_b4;
  undefined1 local_a8 [24];
  Vector3f local_90;
  undefined1 local_84 [12];
  Matrix3f local_78;
  Matrix3f local_54;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar9._0_4_ = randf(rng);
  auVar9._4_60_ = extraout_var;
  if (auVar9._0_4_ < 0.0) {
    fVar5 = sqrtf(auVar9._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar9._0_16_,auVar9._0_16_);
    fVar5 = auVar3._0_4_;
  }
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  iVar2 = (this->super_Camera).width;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (double)fVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (double)x;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = 0.5 - (double)((uint)rVar4 & 1);
  auVar3 = vfmadd213sd_fma(auVar7,auVar12,auVar3);
  auVar10._0_4_ = randf(rng);
  auVar10._4_60_ = extraout_var_00;
  if (auVar10._0_4_ < 0.0) {
    fVar5 = sqrtf(auVar10._0_4_);
  }
  else {
    auVar7 = vsqrtss_avx(auVar10._0_16_,auVar10._0_16_);
    fVar5 = auVar7._0_4_;
  }
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (double)fVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (double)y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = 0.5 - (double)((uint)rVar4 & 1);
  auVar7 = vfmadd213sd_fma(auVar8,auVar13,auVar1);
  Vector3f::Vector3f(&g,(float)(auVar3._0_8_ + (double)((float)(iVar2 + -1) * -0.5)),
                     (float)(auVar7._0_8_ +
                            (double)((float)((this->super_Camera).height + -1) * -0.5)),this->dist);
  Vector3f::normalize(&g);
  fVar5 = randf(rng);
  v = &(this->super_Camera).up;
  fVar6 = cosf(fVar5 * 6.2831855);
  ::operator*((Vector3f *)&local_54,fVar6);
  v0 = &(this->super_Camera).horizontal;
  fVar5 = sinf(fVar5 * 6.2831855);
  ::operator*((Vector3f *)(local_84 + 0xc),fVar5);
  operator+((Vector3f *)&local_54,(Vector3f *)(local_84 + 0xc));
  fVar5 = this->radius;
  auVar11._0_4_ = randf(rng);
  auVar11._4_60_ = extraout_var_01;
  if (auVar11._0_4_ < 0.0) {
    fVar6 = sqrtf(auVar11._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar11._0_16_,auVar11._0_16_);
    fVar6 = auVar3._0_4_;
  }
  Vector3f::operator*=(&df,fVar6 * fVar5);
  operator-(v);
  v2 = &(this->super_Camera).direction;
  Matrix3f::Matrix3f(&local_54,v0,&local_90,v2,true);
  ::operator*((Matrix3f *)local_84,(Vector3f *)&local_54);
  operator+(&(this->super_Camera).center,(Vector3f *)local_84);
  operator-(v);
  Matrix3f::Matrix3f((Matrix3f *)(local_84 + 0xc),v0,&local_b4,v2,true);
  ::operator*(local_cc,this->length);
  operator-(local_cc,&df);
  ::operator*((Matrix3f *)local_a8,(Vector3f *)(local_84 + 0xc));
  Vector3f::normalized((Vector3f *)local_a8);
  Ray::Ray(__return_storage_ptr__,&local_e4,(Vector3f *)(local_a8 + 0xc),3.4028235e+38,0.0);
  return __return_storage_ptr__;
}

Assistant:

Ray generateRay(int x, int y, RNG_TYPE& rng) const override {
		Vector3f g(x + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (width - 1) / 2.0f,
			y + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (height - 1) / 2.0f, dist);
		//Vector3f g((x+randf(rng)-0.5 - (width - 1) / 2.0f), (y+randf(rng)-0.5 - (height - 1) / 2.0f), dist);
		g.normalize();
		float a = randf(rng) * (2 * PI);
		Vector3f df = up * cosf(a) + horizontal * sinf(a); df *= radius*sqrtf(randf(rng));
		return Ray(center + (Matrix3f(horizontal, -up, direction, 1)*df), (Matrix3f(horizontal, -up, direction, 1) *
			(g * length - df)).normalized());
	}